

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

size_t ZSTD_refDictContent(ZSTD_DCtx *dctx,void *dict,size_t dictSize)

{
  size_t dictSize_local;
  void *dict_local;
  ZSTD_DCtx *dctx_local;
  
  dctx->dictEnd = dctx->previousDstEnd;
  dctx->virtualStart = (void *)((long)dict - ((long)dctx->previousDstEnd - (long)dctx->prefixStart))
  ;
  dctx->prefixStart = dict;
  dctx->previousDstEnd = (void *)((long)dict + dictSize);
  return 0;
}

Assistant:

static size_t ZSTD_refDictContent(ZSTD_DCtx* dctx, const void* dict, size_t dictSize)
{
    dctx->dictEnd = dctx->previousDstEnd;
    dctx->virtualStart = (const char*)dict - ((const char*)(dctx->previousDstEnd) - (const char*)(dctx->prefixStart));
    dctx->prefixStart = dict;
    dctx->previousDstEnd = (const char*)dict + dictSize;
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
    dctx->dictContentBeginForFuzzing = dctx->prefixStart;
    dctx->dictContentEndForFuzzing = dctx->previousDstEnd;
#endif
    return 0;
}